

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_base.cpp
# Opt level: O2

ssize_t __thiscall ximu::ReaderBase::read(ReaderBase *this,int __fd,void *__buf,size_t __nbytes)

{
  deque<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  ReadResult RVar1;
  size_type sVar2;
  difference_type dVar3;
  ssize_t extraout_RAX;
  _Self local_210;
  const_iterator local_1f0;
  const_iterator local_1d0;
  iterator local_1b0;
  const_iterator local_190;
  const_iterator local_170;
  const_iterator local_150;
  const_iterator local_130;
  undefined1 local_110 [8];
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> frameBuffer;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> local_d0;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> local_b0;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> local_90;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> local_70;
  _Self local_50;
  
  this_00 = &this->_buffer;
  while( true ) {
    sVar2 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
    if (sVar2 < 5) {
      return sVar2;
    }
    local_d0._M_cur =
         (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur;
    local_d0._M_first =
         (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Deque_impl_data._M_start._M_first;
    local_d0._M_last =
         (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Deque_impl_data._M_start._M_last;
    local_d0._M_node =
         (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Deque_impl_data._M_start._M_node;
    local_b0._M_cur =
         (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur;
    local_b0._M_first =
         (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Deque_impl_data._M_finish._M_first;
    local_b0._M_last =
         (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Deque_impl_data._M_finish._M_last;
    local_b0._M_node =
         (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Deque_impl_data._M_finish._M_node;
    std::
    find_if<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>,bool(*)(unsigned_char)>
              ((_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *)local_110,
               &local_d0,&local_b0,isFrameBuffer);
    if (local_110 ==
        (undefined1  [8])
        (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur) break;
    local_90._M_cur =
         (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur;
    local_90._M_first =
         (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Deque_impl_data._M_start._M_first;
    local_90._M_last =
         (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Deque_impl_data._M_start._M_last;
    local_90._M_node =
         (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Deque_impl_data._M_start._M_node;
    frameBuffer._M_node = (_Map_pointer)local_110;
    dVar3 = std::distance<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>>
                      (&local_90,
                       (_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *)
                       &frameBuffer._M_node);
    if (dVar3 - 0x1fU < 0xffffffffffffffe5) {
      local_1f0._M_cur =
           (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
      local_1f0._M_first =
           (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Deque_impl_data._M_start._M_first;
      local_1f0._M_last =
           (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
      local_1f0._M_node =
           (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Deque_impl_data._M_start._M_node;
      std::operator+(&local_50,
                     (_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *)local_110,1
                    );
      local_1d0._M_cur = local_50._M_cur;
      local_1d0._M_first = local_50._M_first;
      local_1d0._M_last = local_50._M_last;
      local_1d0._M_node = local_50._M_node;
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::erase
                (&local_1b0,this_00,&local_1f0,&local_1d0);
    }
    else {
      local_70._M_cur =
           (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
      local_70._M_first =
           (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Deque_impl_data._M_start._M_first;
      local_70._M_last =
           (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
      local_70._M_node =
           (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Deque_impl_data._M_start._M_node;
      std::operator+(&local_210,
                     (_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *)local_110,1
                    );
      RVar1 = PacketReader::read<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>>
                        (&this->super_PacketReader,&local_70,&local_210);
      if ((RVar1 < 4) && (RVar1 != NOT_IMPLEMENTED)) {
        local_190._M_cur =
             (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
        local_190._M_first =
             (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Deque_impl_data._M_start._M_first;
        local_190._M_last =
             (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last;
        local_190._M_node =
             (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
        std::operator+(&local_50,
                       (_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *)local_110
                       ,1);
        local_170._M_cur = local_50._M_cur;
        local_170._M_first = local_50._M_first;
        local_170._M_last = local_50._M_last;
        local_170._M_node = local_50._M_node;
        std::deque<unsigned_char,_std::allocator<unsigned_char>_>::erase
                  (&local_1b0,this_00,&local_190,&local_170);
      }
      else {
        local_150._M_cur =
             (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
        local_150._M_first =
             (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Deque_impl_data._M_start._M_first;
        local_150._M_last =
             (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last;
        local_150._M_node =
             (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
        std::operator+(&local_50,
                       (_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *)local_110
                       ,1);
        local_130._M_cur = local_50._M_cur;
        local_130._M_first = local_50._M_first;
        local_130._M_last = local_50._M_last;
        local_130._M_node = local_50._M_node;
        std::deque<unsigned_char,_std::allocator<unsigned_char>_>::erase
                  (&local_1b0,this_00,&local_150,&local_130);
      }
    }
  }
  sVar2 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
  if (sVar2 < 0x1f) {
    return sVar2;
  }
  std::deque<unsigned_char,_std::allocator<unsigned_char>_>::clear(this_00);
  return extraout_RAX;
}

Assistant:

void ReaderBase::read() {
  bool done = false;

  // todo @aukedirk no-magic numbers
  while (_buffer.size() > 4 && !done) {

      // locate potential header byte
    auto frameBuffer = std::find_if(
        _buffer.begin(), _buffer.end(), isFrameBuffer);

    // we did not find the framebuffer
    if (frameBuffer == _buffer.end())
    {
        if (_buffer.size() > 30)
            _buffer.clear();
        return;
    }

    // All messages are between 4 and 30 bytes
    size_t msgLength = std::distance(_buffer.begin(),frameBuffer);
    if (msgLength < 4 || msgLength > 30)
    {
        _buffer.erase(_buffer.begin(), frameBuffer + 1);
    }
    else
    {
        //  todo @auke-dirk investigate enum
        //  pass to the packetreader
        switch (PacketReader::read(_buffer.begin(), frameBuffer + 1)) {
          case PacketReader::INVALID_CHECKSUM:
          case PacketReader::OKE:
          case PacketReader::INVALID_PACKET_SIZE:
            _buffer.erase(_buffer.begin(), frameBuffer + 1);
            break;
          default:
            _buffer.erase(_buffer.begin(), frameBuffer + 1);
        }
    }
  }
}